

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int eval_preprocessor_boolean(char *z,int lineno)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  bool bVar5;
  int local_3c;
  int n_1;
  int k_1;
  int j;
  int n;
  int k;
  int i;
  int okTerm;
  int res;
  int neg;
  int lineno_local;
  char *z_local;
  
  bVar2 = false;
  i = 0;
  bVar5 = true;
  n = 0;
  do {
    if (z[n] == '\0') {
      return i;
    }
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[(int)(uint)(byte)z[n]] & 0x2000) == 0) {
      if (z[n] == '!') {
        if (!bVar5) goto LAB_00111c4c;
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else if ((z[n] == '|') && (z[n + 1] == '|')) {
        if (bVar5) goto LAB_00111c4c;
        if (i != 0) {
          return 1;
        }
        bVar5 = true;
        n = n + 1;
      }
      else if ((z[n] == '&') && (z[n + 1] == '&')) {
        if (bVar5) goto LAB_00111c4c;
        if (i == 0) {
          return 0;
        }
        bVar5 = true;
        n = n + 1;
      }
      else if (z[n] == '(') {
        k_1 = 1;
        j = n;
        if (!bVar5) {
LAB_00111c4c:
          if (lineno < 1) {
            return -(n + 1);
          }
          fprintf(_stderr,"%%if syntax error on line %d.\n",(ulong)(uint)lineno);
          fprintf(_stderr,"  %.*s <-- syntax error here\n",(ulong)(n + 1),z);
          exit(1);
        }
        do {
          while( true ) {
            j = j + 1;
            if (z[j] == '\0') goto LAB_00111ace;
            if (z[j] == ')') break;
            if (z[j] == '(') {
              k_1 = k_1 + 1;
            }
            else if (z[j] == '\0') {
              n = j;
              goto LAB_00111c4c;
            }
          }
          k_1 = k_1 + -1;
        } while (k_1 != 0);
        z[j] = '\0';
        i = eval_preprocessor_boolean(z + (n + 1),-1);
        z[j] = ')';
        if (i < 0) {
          n = n - i;
          goto LAB_00111c4c;
        }
        n = j;
LAB_00111ace:
        if (bVar2) {
          i = (int)((i != 0 ^ 0xffU) & 1);
          bVar2 = false;
        }
        bVar5 = false;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        if ((((*ppuVar4)[(int)(uint)(byte)z[n]] & 0x400) == 0) || (iVar3 = n, !bVar5))
        goto LAB_00111c4c;
        do {
          iVar1 = iVar3;
          local_3c = iVar1 + 1;
          ppuVar4 = __ctype_b_loc();
          bVar5 = true;
          if (((*ppuVar4)[(int)(uint)(byte)z[local_3c]] & 8) == 0) {
            bVar5 = z[local_3c] == '_';
          }
          iVar3 = local_3c;
        } while (bVar5);
        i = 0;
        for (n_1 = 0; n_1 < nDefine; n_1 = n_1 + 1) {
          iVar3 = strncmp(azDefine[n_1],z + n,(long)(local_3c - n));
          if ((iVar3 == 0) && (azDefine[n_1][local_3c - n] == '\0')) {
            i = 1;
            break;
          }
        }
        if (bVar2) {
          i = (int)((i != 0 ^ 0xffU) & 1);
          bVar2 = false;
        }
        bVar5 = false;
        n = iVar1;
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

static int eval_preprocessor_boolean(char *z, int lineno){
  int neg = 0;
  int res = 0;
  int okTerm = 1;
  int i;
  for(i=0; z[i]!=0; i++){
    if( ISSPACE(z[i]) ) continue;
    if( z[i]=='!' ){
      if( !okTerm ) goto pp_syntax_error;
      neg = !neg;
      continue;
    }
    if( z[i]=='|' && z[i+1]=='|' ){
      if( okTerm ) goto pp_syntax_error;
      if( res ) return 1;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='&' && z[i+1]=='&' ){
      if( okTerm ) goto pp_syntax_error;
      if( !res ) return 0;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='(' ){
      int k;
      int n = 1;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; z[k]; k++){
        if( z[k]==')' ){
          n--;
          if( n==0 ){
            z[k] = 0;
            res = eval_preprocessor_boolean(&z[i+1], -1);
            z[k] = ')';
            if( res<0 ){
              i = i-res;
              goto pp_syntax_error;
            }
            i = k;
            break;
          }
        }else if( z[k]=='(' ){
          n++;
        }else if( z[k]==0 ){
          i = k;
          goto pp_syntax_error;
        }
      }
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    if( ISALPHA(z[i]) ){
      int j, k, n;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; ISALNUM(z[k]) || z[k]=='_'; k++){}
      n = k - i;
      res = 0;
      for(j=0; j<nDefine; j++){
        if( strncmp(azDefine[j],&z[i],n)==0 && azDefine[j][n]==0 ){
          res = 1;
          break;
        }
      }
      i = k-1;
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    goto pp_syntax_error;
  }
  return res;

pp_syntax_error:
  if( lineno>0 ){
    fprintf(stderr, "%%if syntax error on line %d.\n", lineno);
    fprintf(stderr, "  %.*s <-- syntax error here\n", i+1, z);
    exit(1);
  }else{
    return -(i+1);
  }
}